

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall ot::commissioner::DtlsSession::Reconnect(DtlsSession *this)

{
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_38;
  byte local_11;
  DtlsSession *pDStack_10;
  bool condition;
  DtlsSession *this_local;
  
  local_11 = this->mIsServer & 1;
  pDStack_10 = this;
  if (local_11 != 0) {
    Reset(this);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_38,&this->mOnConnected);
    Connect(this,&local_38);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::~function
              (&local_38);
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp"
                ,0x130,"void ot::commissioner::DtlsSession::Reconnect()");
}

Assistant:

void DtlsSession::Reconnect()
{
    ASSERT(mIsServer);
    Reset();
    Connect(mOnConnected);
}